

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void cleanup_world(void)

{
  char *pcVar1;
  store *psVar2;
  store *next;
  store *store;
  town *town;
  level *level;
  level_map_conflict *map;
  wchar_t i;
  
  for (level = (level *)maps; level != (level *)0x0; level = (level *)level->south) {
    for (map._4_4_ = 0; map._4_4_ < (int)level->topography; map._4_4_ = map._4_4_ + 1) {
      pcVar1 = level->north;
      string_free(*(char **)(pcVar1 + (long)map._4_4_ * 0x50 + 0x18));
      string_free(*(char **)(pcVar1 + (long)map._4_4_ * 0x50 + 0x20));
      string_free(*(char **)(pcVar1 + (long)map._4_4_ * 0x50 + 0x28));
      string_free(*(char **)(pcVar1 + (long)map._4_4_ * 0x50 + 0x30));
      string_free(*(char **)(pcVar1 + (long)map._4_4_ * 0x50 + 0x38));
      string_free(*(char **)(pcVar1 + (long)map._4_4_ * 0x50 + 0x40));
    }
    for (map._4_4_ = 0; map._4_4_ < *(int *)&level->field_0x14; map._4_4_ = map._4_4_ + 1) {
      next = *(store **)(level->east + (long)map._4_4_ * 0x28 + 0x18);
      while (next != (store *)0x0) {
        psVar2 = next->next;
        string_free(next->name);
        free_store(next);
        next = psVar2;
      }
      string_free(*(char **)(level->east + (long)map._4_4_ * 0x28 + 8));
    }
    mem_free(level->east);
    string_free(*(char **)level);
    string_free(*(char **)&level->visited);
    mem_free(level->north);
  }
  return;
}

Assistant:

static void cleanup_world(void)
{
	int i;
	struct level_map *map = maps;
	while (map) {
		for (i = 0; i < map->num_levels; i++) {
			struct level *level = &map->levels[i];
			string_free(level->north);
			string_free(level->east);
			string_free(level->south);
			string_free(level->west);
			string_free(level->up);
			string_free(level->down);
		}
		for (i = 0; i < map->num_towns; i++) {
			struct town *town = &map->towns[i];
			struct store *store = town->stores, *next;
			while (store) {
				next = store->next;
				string_free((char *)store->name);
				free_store(store);
				store = next;
			}
			string_free(map->towns[i].code);
		}
		mem_free(map->towns);
		string_free(map->name);
		string_free(map->help);
		mem_free(map->levels);
		map = map->next;
	}
}